

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_87ea::ShadowedART::assertLowerBoundValid(ShadowedART *this,Key key)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  iterator iVar3;
  _Rb_tree_header *p_Var4;
  art_iterator_t art_it;
  string local_f8;
  key_type local_d8;
  _Rb_tree_color local_d0;
  short local_cc;
  art_iterator_t local_c8;
  string local_38;
  
  local_d8.key_._M_elems._0_4_ = key.key_._M_elems._0_4_;
  local_d8.key_._M_elems._4_2_ = key.key_._M_elems._4_2_;
  iVar3 = std::
          map<(anonymous_namespace)::Key,_unsigned_long,_std::less<(anonymous_namespace)::Key>,_std::allocator<std::pair<const_(anonymous_namespace)::Key,_unsigned_long>_>_>
          ::lower_bound(&this->shadow_,&local_d8);
  art_lower_bound(&local_c8,(art_t *)&this->art_,(art_key_chunk_t *)&local_d8);
  p_Var4 = &(this->shadow_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node != p_Var4) {
    if (local_c8.value == (art_val_t *)0x0) {
      (anonymous_namespace)::Key::string_abi_cxx11_(&local_f8,iVar3._M_node + 1);
      printf("Iterator for key %s is null\n",
             CONCAT26(local_f8._M_dataplus._M_p._6_2_,
                      CONCAT24(local_f8._M_dataplus._M_p._4_2_,
                               (_Rb_tree_color)local_f8._M_dataplus._M_p)));
      puVar1 = (undefined1 *)
               CONCAT26(local_f8._M_dataplus._M_p._6_2_,
                        CONCAT24(local_f8._M_dataplus._M_p._4_2_,
                                 (_Rb_tree_color)local_f8._M_dataplus._M_p));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 != &local_f8.field_2) {
        operator_delete(puVar1);
      }
      _assert_true((ulong)(local_c8.value != (art_val_t *)0x0),"art_it->value != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
                   ,0x8b);
    }
    if ((_Rb_tree_header *)iVar3._M_node != p_Var4) goto LAB_001055fd;
  }
  if (local_c8.value != (art_val_t *)0x0) {
    puts("Iterator is not null");
    _assert_true((ulong)(local_c8.value == (art_val_t *)0x0),"art_it->value == nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
                 ,0x8f);
  }
  if ((_Rb_tree_header *)iVar3._M_node == p_Var4) {
    return;
  }
LAB_001055fd:
  local_f8._M_dataplus._M_p._4_1_ = local_c8.key[4];
  local_f8._M_dataplus._M_p._5_1_ = local_c8.key[5];
  local_f8._M_dataplus._M_p._0_1_ = local_c8.key[0];
  local_f8._M_dataplus._M_p._1_1_ = local_c8.key[1];
  local_f8._M_dataplus._M_p._2_1_ = local_c8.key[2];
  local_f8._M_dataplus._M_p._3_1_ = local_c8.key[3];
  if (local_c8.key._4_2_ != *(short *)&iVar3._M_node[1].field_0x4 ||
      local_c8.key._0_4_ != iVar3._M_node[1]._M_color) {
    (anonymous_namespace)::Key::string_abi_cxx11_(&local_f8,iVar3._M_node + 1);
    uVar2 = CONCAT26(local_f8._M_dataplus._M_p._6_2_,
                     CONCAT24(local_f8._M_dataplus._M_p._4_2_,
                              (_Rb_tree_color)local_f8._M_dataplus._M_p));
    local_cc._0_1_ = local_c8.key[4];
    local_cc._1_1_ = local_c8.key[5];
    local_d0._0_1_ = local_c8.key[0];
    local_d0._1_1_ = local_c8.key[1];
    local_d0._2_1_ = local_c8.key[2];
    local_d0._3_1_ = local_c8.key[3];
    (anonymous_namespace)::Key::string_abi_cxx11_(&local_38,&local_d0);
    printf("Shadow iterator key = %s, ART key = %s\n",uVar2,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    puVar1 = (undefined1 *)
             CONCAT26(local_f8._M_dataplus._M_p._6_2_,
                      CONCAT24(local_f8._M_dataplus._M_p._4_2_,
                               (_Rb_tree_color)local_f8._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != &local_f8.field_2) {
      operator_delete(puVar1);
    }
    local_f8._M_dataplus._M_p._4_1_ = local_c8.key[4];
    local_f8._M_dataplus._M_p._5_1_ = local_c8.key[5];
    local_f8._M_dataplus._M_p._0_1_ = local_c8.key[0];
    local_f8._M_dataplus._M_p._1_1_ = local_c8.key[1];
    local_f8._M_dataplus._M_p._2_1_ = local_c8.key[2];
    local_f8._M_dataplus._M_p._3_1_ = local_c8.key[3];
    _assert_true((ulong)(local_c8.key._4_2_ == *(short *)&iVar3._M_node[1].field_0x4 &&
                        local_c8.key._0_4_ == iVar3._M_node[1]._M_color),
                 "shadow_it->first == Key(art_it->key)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
                 ,0x96);
  }
  return;
}

Assistant:

void assertLowerBoundValid(Key key) {
        auto shadow_it = shadow_.lower_bound(key);
        auto art_it = art_lower_bound(&art_, key.data());
        assertIteratorValid(shadow_it, &art_it);
    }